

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

void __thiscall wasm::Wasm2JSBuilder::addExports(Wasm2JSBuilder *this,Ref ast,Module *wasm)

{
  Export *pEVar1;
  Value *pVVar2;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var3;
  size_t sVar4;
  Ref RVar5;
  ostream *os;
  Ref RVar6;
  Ref RVar7;
  Ref RVar8;
  Fatal *this_00;
  pointer puVar9;
  Ref value;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  Ref in_R8;
  IString name;
  IString name_00;
  IString name_01;
  IString name_02;
  IString name_03;
  IString name_04;
  IString name_05;
  IString name_06;
  IString name_07;
  IString name_08;
  IString IVar10;
  undefined1 auVar11 [16];
  IString IVar12;
  IString key;
  IString key_00;
  IString op;
  IString key_01;
  IString key_02;
  IString key_03;
  IString key_04;
  IString key_05;
  IString key_06;
  IString key_07;
  IString key_08;
  IString key_09;
  IString param;
  undefined1 local_2e0 [8];
  Ref block;
  ostream local_2d0 [376];
  string local_158;
  IString local_138;
  IString local_128;
  IString local_118;
  IString local_108;
  IString local_f8;
  IString local_e8;
  IString local_d8;
  IString local_c8;
  IString local_b8;
  IString local_a8;
  string_view local_98;
  pointer local_88;
  Ref local_80;
  Ref local_78;
  Ref block_1;
  undefined1 local_58 [8];
  IString identName;
  char *extraout_RDX;
  
  local_80.inst = ast.inst;
  identName.str._M_str = (char *)cashew::ValueBuilder::makeObject();
  local_88 = (wasm->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar9 = (wasm->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; RVar5.inst = local_80.inst,
      puVar9 != local_88; puVar9 = puVar9 + 1) {
    pEVar1 = (puVar9->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
             super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    switch(pEVar1->kind) {
    case Function:
      IVar12 = fromName(this,(IString)(pEVar1->name).super_IString,Export);
      key.str._M_len = IVar12.str._M_str;
      IVar10 = fromName(this,(((puVar9->_M_t).
                               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                               .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->value).
                             super_IString.str,Top);
      name.str._M_str = IVar10.str._M_str;
      name.str._M_len = (size_t)name.str._M_str;
      RVar5 = cashew::ValueBuilder::makeName((ValueBuilder *)IVar10.str._M_len,name);
      key.str._M_str = (char *)RVar5.inst;
      cashew::ValueBuilder::appendToObjectWithQuotes
                ((ValueBuilder *)identName.str._M_str,(Value *)IVar12.str._M_len,key,in_R8);
      break;
    case Table:
      IVar12 = fromName(this,(IString)(pEVar1->name).super_IString,Export);
      name_03.str._M_str = IVar12.str._M_str;
      name_03.str._M_len = _isBottom;
      RVar5 = cashew::ValueBuilder::makeName(FUNCTION_TABLE,name_03);
      key_02.str._M_str = (char *)RVar5.inst;
      key_02.str._M_len = (size_t)name_03.str._M_str;
      cashew::ValueBuilder::appendToObjectWithQuotes
                ((ValueBuilder *)identName.str._M_str,(Value *)IVar12.str._M_len,key_02,in_R8);
      break;
    case Memory:
      RVar5 = cashew::ValueBuilder::makeObject();
      RVar8 = cashew::ValueBuilder::makeObject();
      IString::IString(&local_138,"grow");
      key_03.str._M_str = (char *)RVar8.inst;
      key_03.str._M_len = (size_t)local_138.str._M_str;
      cashew::ValueBuilder::appendToObjectWithQuotes
                ((ValueBuilder *)RVar5.inst,(Ref)local_138.str._M_len,key_03,in_R8);
      _Var3._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (((wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
      if (*(ulong *)((long)_Var3._M_t.
                           super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                           .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x38) <
          *(ulong *)((long)_Var3._M_t.
                           super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                           .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x40)) {
        IString::IString(&local_128,"value");
        name_04.str._M_str = extraout_RDX_00;
        name_04.str._M_len = _visitRefAs;
        RVar6 = cashew::ValueBuilder::makeName(WASM_MEMORY_GROW,name_04);
        key_04.str._M_str = (char *)RVar6.inst;
        key_04.str._M_len = (size_t)local_128.str._M_str;
        cashew::ValueBuilder::appendToObjectWithQuotes
                  ((ValueBuilder *)RVar8.inst,(Ref)local_128.str._M_len,key_04,in_R8);
      }
      RVar8 = cashew::ValueBuilder::makeObject();
      IString::IString(&local_118,"");
      name_05.str._M_str = extraout_RDX_01;
      name_05.str._M_len = (size_t)local_118.str._M_str;
      local_2e0 = (undefined1  [8])
                  cashew::ValueBuilder::makeFunction((ValueBuilder *)local_118.str._M_len,name_05);
      auVar11 = cashew::Ref::operator[]((uint)local_2e0);
      name_06.str._M_str = auVar11._8_8_;
      pVVar2 = (Value *)*auVar11._0_8_;
      name_06.str._M_len = cashew::LOAD;
      RVar6 = cashew::ValueBuilder::makeName(BUFFER,name_06);
      RVar6 = cashew::ValueBuilder::makeReturn(RVar6);
      cashew::Value::push_back(pVVar2,RVar6);
      IString::IString(&local_108,"get");
      key_05.str._M_str = (char *)local_2e0;
      key_05.str._M_len = (size_t)local_108.str._M_str;
      cashew::ValueBuilder::appendToObjectWithQuotes
                ((ValueBuilder *)RVar8.inst,(Ref)local_108.str._M_len,key_05,in_R8);
      IString::IString(&local_f8,"buffer");
      key_06.str._M_str = (char *)RVar8.inst;
      key_06.str._M_len = (size_t)local_f8.str._M_str;
      cashew::ValueBuilder::appendToObjectWithQuotes
                ((ValueBuilder *)RVar5.inst,(Ref)local_f8.str._M_len,key_06,in_R8);
      IString::IString(&local_e8,"Object");
      name_07.str._M_str = extraout_RDX_02;
      name_07.str._M_len = (size_t)local_e8.str._M_str;
      RVar6 = cashew::ValueBuilder::makeName((ValueBuilder *)local_e8.str._M_len,name_07);
      IString::IString(&local_d8,"create");
      key_07.str._M_str = (char *)RVar8.inst;
      key_07.str._M_len = (size_t)local_d8.str._M_str;
      RVar6 = cashew::ValueBuilder::makeDot(RVar6.inst,(Ref)local_d8.str._M_len,key_07);
      IString::IString(&local_c8,"Object");
      name_08.str._M_str = extraout_RDX_03;
      name_08.str._M_len = (size_t)local_c8.str._M_str;
      RVar7 = cashew::ValueBuilder::makeName((ValueBuilder *)local_c8.str._M_len,name_08);
      IString::IString(&local_b8,"prototype");
      key_08.str._M_str = (char *)RVar8.inst;
      key_08.str._M_len = (size_t)local_b8.str._M_str;
      RVar8 = cashew::ValueBuilder::makeDot(RVar7.inst,(Ref)local_b8.str._M_len,key_08);
      RVar8 = cashew::ValueBuilder::makeCall(RVar6,RVar8);
      cashew::ValueBuilder::appendToCall(RVar8,RVar5);
      IVar12 = fromName(this,(IString)(((puVar9->_M_t).
                                        super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                        .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)
                                      ->name).super_IString,Export);
      key_09.str._M_len = IVar12.str._M_str;
      key_09.str._M_str = (char *)RVar8.inst;
      cashew::ValueBuilder::appendToObjectWithQuotes
                ((ValueBuilder *)identName.str._M_str,(Value *)IVar12.str._M_len,key_09,in_R8);
      break;
    case Global:
      RVar8 = cashew::ValueBuilder::makeObject();
      _local_58 = (string_view)
                  fromName(this,(Name)(((puVar9->_M_t).
                                        super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                        .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)
                                      ->value).super_IString.str,Top);
      local_2e0 = (undefined1  [8])cashew::ValueBuilder::makeBlock();
      auVar11 = cashew::Ref::operator[]((uint)(ostringstream *)local_2e0);
      name_00.str._M_str = auVar11._8_8_;
      pVVar2 = (Value *)*auVar11._0_8_;
      name_00.str._M_len = identName.str._M_len;
      RVar5 = cashew::ValueBuilder::makeName((ValueBuilder *)local_58,name_00);
      RVar5 = cashew::ValueBuilder::makeReturn(RVar5);
      cashew::Value::push_back(pVVar2,RVar5);
      IString::IString(&local_a8,"value");
      key_00.str._M_str = (char *)local_2e0;
      key_00.str._M_len = (size_t)local_a8.str._M_str;
      cashew::ValueBuilder::appendToObjectAsGetter
                ((ValueBuilder *)RVar8.inst,(Ref)local_a8.str._M_len,key_00,in_R8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e0);
      os = std::operator<<((ostream *)local_2e0,'_');
      std::operator<<(os,(IString *)local_58);
      std::__cxx11::stringbuf::str();
      IVar12 = stringToIString(&local_158);
      value.inst = (Value *)IVar12.str._M_str;
      block_1.inst = (Value *)IVar12.str._M_len;
      std::__cxx11::string::~string((string *)&local_158);
      local_78 = cashew::ValueBuilder::makeBlock();
      auVar11 = cashew::Ref::operator[]((uint)&local_78);
      name_01.str._M_str = auVar11._8_8_;
      pVVar2 = (Value *)*auVar11._0_8_;
      name_01.str._M_len = identName.str._M_len;
      RVar6 = cashew::ValueBuilder::makeName((ValueBuilder *)local_58,name_01);
      sVar4 = BLOCK;
      RVar5.inst = cashew::SET.inst;
      name_02.str._M_str = extraout_RDX;
      name_02.str._M_len = (size_t)value.inst;
      RVar7 = cashew::ValueBuilder::makeName(block_1.inst,name_02);
      op.str._M_str = (char *)RVar7.inst;
      op.str._M_len = sVar4;
      RVar5 = cashew::ValueBuilder::makeBinary(RVar6.inst,RVar5,op,in_R8);
      cashew::Value::push_back(pVVar2,RVar5);
      IString::IString((IString *)&local_98,"value");
      param.str._M_str = (char *)value.inst;
      param.str._M_len = (size_t)block_1.inst;
      cashew::ValueBuilder::appendToObjectAsSetter(RVar8,(IString)local_98,param,local_78);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e0);
      IVar12 = fromName(this,(IString)(((puVar9->_M_t).
                                        super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                        .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)
                                      ->name).super_IString,Export);
      key_01.str._M_len = IVar12.str._M_str;
      key_01.str._M_str = (char *)RVar8.inst;
      cashew::ValueBuilder::appendToObjectWithQuotes
                ((ValueBuilder *)identName.str._M_str,(Value *)IVar12.str._M_len,key_01,value);
      in_R8.inst = value.inst;
      break;
    case Invalid:
    case Tag:
      Fatal::Fatal((Fatal *)local_2e0);
      std::operator<<(local_2d0,"unsupported export type: ");
      this_00 = Fatal::operator<<((Fatal *)local_2e0,
                                  &((puVar9->_M_t).
                                    super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                    .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->
                                   name);
      Fatal::operator<<(this_00,(char (*) [2])0x18d317);
      Fatal::~Fatal((Fatal *)local_2e0);
    }
  }
  if ((wasm->memories).
      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (wasm->memories).
      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    addMemoryFuncs(this,local_80,wasm);
  }
  RVar8 = cashew::ValueBuilder::makeReturn((Ref)identName.str._M_str);
  cashew::Value::push_back(RVar5.inst,RVar8);
  return;
}

Assistant:

void Wasm2JSBuilder::addExports(Ref ast, Module* wasm) {
  Ref exports = ValueBuilder::makeObject();
  for (auto& export_ : wasm->exports) {
    switch (export_->kind) {
      case ExternalKind::Function: {
        ValueBuilder::appendToObjectWithQuotes(
          exports,
          fromName(export_->name, NameScope::Export),
          ValueBuilder::makeName(fromName(export_->value, NameScope::Top)));
        break;
      }
      case ExternalKind::Memory: {
        Ref descs = ValueBuilder::makeObject();
        Ref growDesc = ValueBuilder::makeObject();
        ValueBuilder::appendToObjectWithQuotes(
          descs, IString("grow"), growDesc);
        if (wasm->memories[0]->max > wasm->memories[0]->initial) {
          ValueBuilder::appendToObjectWithQuotes(
            growDesc,
            IString("value"),
            ValueBuilder::makeName(WASM_MEMORY_GROW));
        }
        Ref bufferDesc = ValueBuilder::makeObject();
        Ref bufferGetter = ValueBuilder::makeFunction(IString(""));
        bufferGetter[3]->push_back(
          ValueBuilder::makeReturn(ValueBuilder::makeName(BUFFER)));
        ValueBuilder::appendToObjectWithQuotes(
          bufferDesc, IString("get"), bufferGetter);
        ValueBuilder::appendToObjectWithQuotes(
          descs, IString("buffer"), bufferDesc);
        Ref memory = ValueBuilder::makeCall(
          ValueBuilder::makeDot(ValueBuilder::makeName(IString("Object")),
                                IString("create")),
          ValueBuilder::makeDot(ValueBuilder::makeName(IString("Object")),
                                IString("prototype")));
        ValueBuilder::appendToCall(memory, descs);
        ValueBuilder::appendToObjectWithQuotes(
          exports, fromName(export_->name, NameScope::Export), memory);
        break;
      }
      case ExternalKind::Table: {
        ValueBuilder::appendToObjectWithQuotes(
          exports,
          fromName(export_->name, NameScope::Export),
          ValueBuilder::makeName(FUNCTION_TABLE));
        break;
      }
      case ExternalKind::Global: {
        Ref object = ValueBuilder::makeObject();

        IString identName = fromName(export_->value, NameScope::Top);

        // getter
        {
          Ref block = ValueBuilder::makeBlock();

          block[1]->push_back(
            ValueBuilder::makeReturn(ValueBuilder::makeName(identName)));

          ValueBuilder::appendToObjectAsGetter(object, IString("value"), block);
        }

        // setter
        {
          std::ostringstream buffer;
          buffer << '_' << identName;
          auto setterParam = stringToIString(buffer.str());

          auto block = ValueBuilder::makeBlock();

          block[1]->push_back(
            ValueBuilder::makeBinary(ValueBuilder::makeName(identName),
                                     SET,
                                     ValueBuilder::makeName(setterParam)));

          ValueBuilder::appendToObjectAsSetter(
            object, IString("value"), setterParam, block);
        }

        ValueBuilder::appendToObjectWithQuotes(
          exports, fromName(export_->name, NameScope::Export), object);

        break;
      }
      case ExternalKind::Tag:
      case ExternalKind::Invalid:
        Fatal() << "unsupported export type: " << export_->name << "\n";
    }
  }
  if (!wasm->memories.empty()) {
    addMemoryFuncs(ast, wasm);
  }
  ast->push_back(
    ValueBuilder::makeStatement(ValueBuilder::makeReturn(exports)));
}